

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

OPJ_BOOL opj_j2k_decode_tile(opj_j2k_t *p_j2k,OPJ_UINT32 p_tile_index,OPJ_BYTE *p_data,
                            OPJ_UINT32 p_data_size,opj_stream_private_t *p_stream,
                            opj_event_mgr_t *p_manager)

{
  byte *pbVar1;
  opj_tcp_t *p_tcp;
  opj_tcp_t *poVar2;
  OPJ_BYTE *p_src;
  OPJ_BOOL OVar3;
  OPJ_OFF_T OVar4;
  OPJ_SIZE_T OVar5;
  char *fmt;
  OPJ_INT32 event_type;
  opj_image_t *poVar6;
  OPJ_BYTE l_data [2];
  OPJ_UINT32 l_current_marker;
  
  if (p_stream == (opj_stream_private_t *)0x0) {
    __assert_fail("p_stream != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x22de,
                  "OPJ_BOOL opj_j2k_decode_tile(opj_j2k_t *, OPJ_UINT32, OPJ_BYTE *, OPJ_UINT32, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x22df,
                  "OPJ_BOOL opj_j2k_decode_tile(opj_j2k_t *, OPJ_UINT32, OPJ_BYTE *, OPJ_UINT32, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x22e0,
                  "OPJ_BOOL opj_j2k_decode_tile(opj_j2k_t *, OPJ_UINT32, OPJ_BYTE *, OPJ_UINT32, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if ((undefined1  [88])((undefined1  [88])p_j2k->m_specific_param & (undefined1  [88])0x80) ==
      (undefined1  [88])0x0) {
    return 0;
  }
  if (p_j2k->m_current_tile_number != p_tile_index) {
    return 0;
  }
  poVar2 = (p_j2k->m_cp).tcps;
  p_tcp = poVar2 + p_tile_index;
  p_src = poVar2[p_tile_index].m_data;
  if (p_src == (OPJ_BYTE *)0x0) {
    opj_j2k_tcp_destroy(p_tcp);
    return 0;
  }
  poVar6 = p_j2k->m_output_image;
  if (poVar6 == (opj_image_t *)0x0) {
    poVar6 = p_j2k->m_private_image;
  }
  OVar3 = opj_tcd_decode_tile(p_j2k->m_tcd,poVar6->x0,poVar6->y0,poVar6->x1,poVar6->y1,
                              (p_j2k->m_specific_param).m_decoder.m_numcomps_to_decode,
                              (p_j2k->m_specific_param).m_decoder.m_comps_indices_to_decode,p_src,
                              p_tcp->m_data_size,p_tile_index,p_j2k->cstr_index,p_manager);
  if (OVar3 == 0) {
    opj_j2k_tcp_destroy(p_tcp);
    pbVar1 = (byte *)((long)&p_j2k->m_specific_param + 1);
    *pbVar1 = *pbVar1 | 0x80;
    fmt = "Failed to decode.\n";
  }
  else {
    if (p_data != (OPJ_BYTE *)0x0) {
      OVar3 = opj_tcd_update_tile_data(p_j2k->m_tcd,p_data,p_data_size);
      if (OVar3 == 0) {
        return 0;
      }
      if (p_tcp->m_data != (OPJ_BYTE *)0x0) {
        opj_free(p_tcp->m_data);
        p_tcp->m_data = (OPJ_BYTE *)0x0;
        p_tcp->m_data_size = 0;
      }
    }
    pbVar1 = (byte *)((long)&p_j2k->m_specific_param + 0x50);
    *pbVar1 = *pbVar1 & 0xfe;
    *(byte *)&p_j2k->m_specific_param = *(byte *)&p_j2k->m_specific_param & 0x7f;
    OVar4 = opj_stream_get_number_byte_left(p_stream);
    if ((OVar4 == 0) && ((p_j2k->m_specific_param).m_decoder.m_state == 0x40)) {
      return 1;
    }
    OVar3 = 1;
    if ((p_j2k->m_specific_param).m_decoder.m_state == 0x100) {
      return 1;
    }
    OVar5 = opj_stream_read_data(p_stream,l_data,2,p_manager);
    if (OVar5 == 2) {
      opj_read_bytes_LE(l_data,&l_current_marker,2);
      if (l_current_marker == 0xff90) {
        return 1;
      }
      if (l_current_marker == 0xffd9) {
        p_j2k->m_current_tile_number = 0;
        (p_j2k->m_specific_param).m_decoder.m_state = 0x100;
        return 1;
      }
      OVar4 = opj_stream_get_number_byte_left(p_stream);
      if (OVar4 == 0) {
        (p_j2k->m_specific_param).m_decoder.m_state = 0x40;
        fmt = "Stream does not end with EOC\n";
        event_type = 2;
        goto LAB_001118bd;
      }
      fmt = "Stream too short, expected SOT\n";
    }
    else {
      fmt = "Stream too short\n";
    }
  }
  OVar3 = 0;
  event_type = 1;
LAB_001118bd:
  opj_event_msg(p_manager,event_type,fmt);
  return OVar3;
}

Assistant:

OPJ_BOOL opj_j2k_decode_tile(opj_j2k_t * p_j2k,
                             OPJ_UINT32 p_tile_index,
                             OPJ_BYTE * p_data,
                             OPJ_UINT32 p_data_size,
                             opj_stream_private_t *p_stream,
                             opj_event_mgr_t * p_manager)
{
    OPJ_UINT32 l_current_marker;
    OPJ_BYTE l_data [2];
    opj_tcp_t * l_tcp;
    opj_image_t* l_image_for_bounds;

    /* preconditions */
    assert(p_stream != 00);
    assert(p_j2k != 00);
    assert(p_manager != 00);

    if (!(p_j2k->m_specific_param.m_decoder.m_state & J2K_STATE_DATA)
            || (p_tile_index != p_j2k->m_current_tile_number)) {
        return OPJ_FALSE;
    }

    l_tcp = &(p_j2k->m_cp.tcps[p_tile_index]);
    if (! l_tcp->m_data) {
        opj_j2k_tcp_destroy(l_tcp);
        return OPJ_FALSE;
    }

    /* When using the opj_read_tile_header / opj_decode_tile_data API */
    /* such as in test_tile_decoder, m_output_image is NULL, so fall back */
    /* to the full image dimension. This is a bit surprising that */
    /* opj_set_decode_area() is only used to determinte intersecting tiles, */
    /* but full tile decoding is done */
    l_image_for_bounds = p_j2k->m_output_image ? p_j2k->m_output_image :
                         p_j2k->m_private_image;
    if (! opj_tcd_decode_tile(p_j2k->m_tcd,
                              l_image_for_bounds->x0,
                              l_image_for_bounds->y0,
                              l_image_for_bounds->x1,
                              l_image_for_bounds->y1,
                              p_j2k->m_specific_param.m_decoder.m_numcomps_to_decode,
                              p_j2k->m_specific_param.m_decoder.m_comps_indices_to_decode,
                              l_tcp->m_data,
                              l_tcp->m_data_size,
                              p_tile_index,
                              p_j2k->cstr_index, p_manager)) {
        opj_j2k_tcp_destroy(l_tcp);
        p_j2k->m_specific_param.m_decoder.m_state |= J2K_STATE_ERR;
        opj_event_msg(p_manager, EVT_ERROR, "Failed to decode.\n");
        return OPJ_FALSE;
    }

    /* p_data can be set to NULL when the call will take care of using */
    /* itself the TCD data. This is typically the case for whole single */
    /* tile decoding optimization. */
    if (p_data != NULL) {
        if (! opj_tcd_update_tile_data(p_j2k->m_tcd, p_data, p_data_size)) {
            return OPJ_FALSE;
        }

        /* To avoid to destroy the tcp which can be useful when we try to decode a tile decoded before (cf j2k_random_tile_access)
        * we destroy just the data which will be re-read in read_tile_header*/
        /*opj_j2k_tcp_destroy(l_tcp);
        p_j2k->m_tcd->tcp = 0;*/
        opj_j2k_tcp_data_destroy(l_tcp);
    }

    p_j2k->m_specific_param.m_decoder.m_can_decode = 0;
    p_j2k->m_specific_param.m_decoder.m_state &= (~(OPJ_UINT32)J2K_STATE_DATA);

    if (opj_stream_get_number_byte_left(p_stream) == 0
            && p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_NEOC) {
        return OPJ_TRUE;
    }

    if (p_j2k->m_specific_param.m_decoder.m_state != J2K_STATE_EOC) {
        if (opj_stream_read_data(p_stream, l_data, 2, p_manager) != 2) {
            opj_event_msg(p_manager, EVT_ERROR, "Stream too short\n");
            return OPJ_FALSE;
        }

        opj_read_bytes(l_data, &l_current_marker, 2);

        if (l_current_marker == J2K_MS_EOC) {
            p_j2k->m_current_tile_number = 0;
            p_j2k->m_specific_param.m_decoder.m_state = J2K_STATE_EOC;
        } else if (l_current_marker != J2K_MS_SOT) {
            if (opj_stream_get_number_byte_left(p_stream) == 0) {
                p_j2k->m_specific_param.m_decoder.m_state = J2K_STATE_NEOC;
                opj_event_msg(p_manager, EVT_WARNING, "Stream does not end with EOC\n");
                return OPJ_TRUE;
            }
            opj_event_msg(p_manager, EVT_ERROR, "Stream too short, expected SOT\n");
            return OPJ_FALSE;
        }
    }

    return OPJ_TRUE;
}